

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

void * CallbackThreadFunc(void *userData)

{
  PaUtilBufferProcessor *bp;
  PaUtilCpuLoadMeasurer *measurer;
  unsigned_long numFrames;
  int iVar1;
  ulong uVar2;
  int *__retval;
  PaError PVar3;
  int priming;
  char *pcVar4;
  ulong callbackStatusFlags;
  int xrun;
  int callbackResult;
  unsigned_long framesAvail;
  PaUnixThread *local_c8;
  unsigned_long local_c0;
  PaStreamCallbackTimeInfo timeInfo;
  __pthread_unwind_buf_t __cancel_buf;
  
  timeInfo.inputBufferAdcTime = 0.0;
  timeInfo.currentTime = 0.0;
  timeInfo.outputBufferDacTime = 0.0;
  callbackResult = 0;
  if (userData == (void *)0x0) {
    __assert_fail("stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x1051,"void *CallbackThreadFunc(void *)");
  }
  priming = 0;
  iVar1 = __sigsetjmp(&__cancel_buf);
  if (iVar1 != 0) {
    OnExit(userData);
    __pthread_unwind_next((__pthread_unwind_buf_t *)&__cancel_buf);
LAB_0010cf6e:
    __assert_fail("!xrun",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x10e7,"void *CallbackThreadFunc(void *)");
  }
  __pthread_register_cancel((__pthread_unwind_buf_t *)&__cancel_buf);
  if (*(int *)((long)userData + 0x220) != 0) {
    __assert_fail("!stream->primeBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x1057,"void *CallbackThreadFunc(void *)");
  }
  local_c8 = (PaUnixThread *)((long)userData + 0x198);
  paUtilErr_ = PaUnixThread_PrepareNotify(local_c8);
  if (paUtilErr_ < 0) {
    pcVar4 = 
    "Expression \'PaUnixThread_PrepareNotify( &stream->thread )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4205\n"
    ;
  }
  else {
    paUtilErr_ = AlsaStart((PaAlsaStream *)userData,priming);
    if (paUtilErr_ < 0) {
      pcVar4 = 
      "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4207\n"
      ;
    }
    else {
      paUtilErr_ = PaUnixThread_NotifyParent(local_c8);
      if (-1 < paUtilErr_) {
        bp = (PaUtilBufferProcessor *)((long)userData + 0x68);
        measurer = (PaUtilCpuLoadMeasurer *)((long)userData + 0x50);
LAB_0010ccb9:
        do {
          xrun = 0;
          pthread_testcancel();
          iVar1 = PaUnixThread_StopRequested(local_c8);
          if (callbackResult == 0 && iVar1 != 0) {
            callbackResult = 1;
LAB_0010ccf4:
            *(uint *)((long)userData + 0x240) = (uint)(callbackResult == 2);
            PVar3 = 0;
            if ((*(int *)((long)userData + 0x240) != 0) ||
               (iVar1 = PaUtil_IsBufferProcessorOutputEmpty(bp), iVar1 != 0)) goto LAB_0010cf2b;
          }
          else if (callbackResult != 0) goto LAB_0010ccf4;
          paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)userData,&framesAvail,&xrun);
          if (paUtilErr_ < 0) {
            pcVar4 = 
            "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4248\n"
            ;
LAB_0010cf1a:
            PaUtil_DebugPrint(pcVar4);
            PVar3 = paUtilErr_;
            goto LAB_0010cf2b;
          }
          if (xrun == 0) {
            if (framesAvail != 0) {
              while( true ) {
                xrun = 0;
                pthread_testcancel();
                if (*(double *)((long)userData + 0x278) <= 0.0) {
                  uVar2 = 0;
                }
                else {
                  *(undefined8 *)((long)userData + 0x278) = 0;
                  uVar2 = 4;
                }
                if (0.0 < *(double *)((long)userData + 0x280)) {
                  uVar2 = uVar2 | 2;
                  *(undefined8 *)((long)userData + 0x280) = 0;
                }
                callbackStatusFlags = uVar2;
                if ((*(long *)((long)userData + 0x2c0) != 0) &&
                   (*(long *)((long)userData + 0x340) != 0)) {
                  if (*(int *)((long)userData + 0x2e0) == 0) {
                    callbackStatusFlags = uVar2 | 1;
                  }
                  else {
                    callbackStatusFlags = uVar2 + 8;
                    if (*(int *)((long)userData + 0x360) != 0) {
                      callbackStatusFlags = uVar2;
                    }
                  }
                }
                CalculateTimeInfo((PaAlsaStream *)userData,&timeInfo);
                PaUtil_BeginBufferProcessing(bp,&timeInfo,callbackStatusFlags);
                PaUtil_BeginCpuLoadMeasurement(measurer);
                if (*(int *)((long)userData + 0x78) == 1) {
                  local_c0 = *(ulong *)((long)userData + 0x218);
                  if (framesAvail < *(ulong *)((long)userData + 0x218)) {
                    local_c0 = framesAvail;
                  }
                }
                else {
                  if (*(int *)((long)userData + 0x78) != 0) {
                    __assert_fail("paUtilBoundedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                                  ,0x10de,"void *CallbackThreadFunc(void *)");
                  }
                  local_c0 = 0;
                  if (*(ulong *)((long)userData + 0x218) <= framesAvail) {
                    local_c0 = *(ulong *)((long)userData + 0x218);
                  }
                }
                paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)userData,&local_c0,&xrun);
                numFrames = local_c0;
                if (paUtilErr_ < 0) {
                  pcVar4 = 
                  "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4321\n"
                  ;
                  goto LAB_0010cf1a;
                }
                framesAvail = framesAvail - local_c0;
                if (local_c0 == 0) break;
                if (xrun != 0) goto LAB_0010cf6e;
                PaUtil_EndBufferProcessing(bp,&callbackResult);
                paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)userData,numFrames,&xrun);
                if (paUtilErr_ < 0) {
                  pcVar4 = 
                  "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4329\n"
                  ;
                  goto LAB_0010cf1a;
                }
                PaUtil_EndCpuLoadMeasurement(measurer,numFrames);
                if ((callbackResult != 0) || (framesAvail == 0)) goto LAB_0010ccb9;
              }
              PaUtil_EndCpuLoadMeasurement(measurer,0);
            }
          }
          else if (framesAvail != 0) {
            __assert_fail("0 == framesAvail",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                          ,0x109b,"void *CallbackThreadFunc(void *)");
          }
        } while( true );
      }
      pcVar4 = 
      "Expression \'PaUnixThread_NotifyParent( &stream->thread )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4208\n"
      ;
    }
  }
  PaUtil_DebugPrint(pcVar4);
  PVar3 = paUtilErr_;
LAB_0010cf2b:
  __pthread_unregister_cancel((__pthread_unwind_buf_t *)&__cancel_buf);
  OnExit(userData);
  if (PVar3 != 0) {
    __retval = (int *)malloc(4);
    *__retval = PVar3;
    pthread_exit(__retval);
  }
  pthread_exit((void *)0x0);
}

Assistant:

static void *CallbackThreadFunc( void *userData )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*) userData;
    PaStreamCallbackTimeInfo timeInfo = {0, 0, 0};
    snd_pcm_sframes_t startThreshold = 0;
    int callbackResult = paContinue;
    PaStreamCallbackFlags cbFlags = 0;  /* We might want to keep state across iterations */
    int streamStarted = 0;

    assert( stream );

    /* Execute OnExit when exiting */
    pthread_cleanup_push( &OnExit, stream );

    /* Not implemented */
    assert( !stream->primeBuffers );

    /* @concern StreamStart If the output is being primed the output pcm needs to be prepared, otherwise the
     * stream is started immediately. The latter involves signaling the waiting main thread.
     */
    if( stream->primeBuffers )
    {
        snd_pcm_sframes_t avail;

        if( stream->playback.pcm )
            ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
        if( stream->capture.pcm && !stream->pcmsSynced )
            ENSURE_( alsa_snd_pcm_prepare( stream->capture.pcm ), paUnanticipatedHostError );

        /* We can't be certain that the whole ring buffer is available for priming, but there should be
         * at least one period */
        avail = alsa_snd_pcm_avail_update( stream->playback.pcm );
        startThreshold = avail - (avail % stream->playback.framesPerPeriod);
        assert( startThreshold >= stream->playback.framesPerPeriod );
    }
    else
    {
        PA_ENSURE( PaUnixThread_PrepareNotify( &stream->thread ) );
        /* Buffer will be zeroed */
        PA_ENSURE( AlsaStart( stream, 0 ) );
        PA_ENSURE( PaUnixThread_NotifyParent( &stream->thread ) );

        streamStarted = 1;
    }

    while( 1 )
    {
        unsigned long framesAvail, framesGot;
        int xrun = 0;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif

        /* @concern StreamStop if the main thread has requested a stop and the stream has not been effectively
         * stopped we signal this condition by modifying callbackResult (we'll want to flush buffered output).
         */
        if( PaUnixThread_StopRequested( &stream->thread ) && paContinue == callbackResult )
        {
            PA_DEBUG(( "Setting callbackResult to paComplete\n" ));
            callbackResult = paComplete;
        }

        if( paContinue != callbackResult )
        {
            stream->callbackAbort = ( paAbort == callbackResult );
            if( stream->callbackAbort ||
                    /** @concern BlockAdaption: Go on if adaption buffers are empty */
                    PaUtil_IsBufferProcessorOutputEmpty( &stream->bufferProcessor ) )
            {
                goto end;
            }

            PA_DEBUG(( "%s: Flushing buffer processor\n", __FUNCTION__ ));
            /* There is still buffered output that needs to be processed */
        }

        /* Wait for data to become available, this comes down to polling the ALSA file descriptors untill we have
         * a number of available frames.
         */
        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        if( xrun )
        {
            assert( 0 == framesAvail );
            continue;

            /* XXX: Report xruns to the user? A situation is conceivable where the callback is never invoked due
             * to constant xruns, it might be desirable to notify the user of this.
             */
        }

        /* Consume buffer space. Once we have a number of frames available for consumption we must retrieve the
         * mmapped buffers from ALSA, this is contiguously accessible memory however, so we may receive smaller
         * portions at a time than is available as a whole. Therefore we should be prepared to process several
         * chunks successively. The buffers are passed to the PA buffer processor.
         */
        while( framesAvail > 0 )
        {
            xrun = 0;

#ifdef PTHREAD_CANCELED
           pthread_testcancel();
#endif

            /** @concern Xruns Under/overflows are to be reported to the callback */
            if( stream->underrun > 0.0 )
            {
                cbFlags |= paOutputUnderflow;
                stream->underrun = 0.0;
            }
            if( stream->overrun > 0.0 )
            {
                cbFlags |= paInputOverflow;
                stream->overrun = 0.0;
            }
            if( stream->capture.pcm && stream->playback.pcm )
            {
                /** @concern FullDuplex It's possible that only one direction is being processed to avoid an
                 * under- or overflow, this should be reported correspondingly */
                if( !stream->capture.ready )
                {
                    cbFlags |= paInputUnderflow;
                    PA_DEBUG(( "%s: Input underflow\n", __FUNCTION__ ));
                }
                else if( !stream->playback.ready )
                {
                    cbFlags |= paOutputOverflow;
                    PA_DEBUG(( "%s: Output overflow\n", __FUNCTION__ ));
                }
            }

#if 0
            CallbackUpdate( &stream->threading );
#endif
            CalculateTimeInfo( stream, &timeInfo );
            PaUtil_BeginBufferProcessing( &stream->bufferProcessor, &timeInfo, cbFlags );
            cbFlags = 0;

            /* CPU load measurement should include processing activivity external to the stream callback */
            PaUtil_BeginCpuLoadMeasurement( &stream->cpuLoadMeasurer );

            framesGot = framesAvail;
            if( paUtilFixedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode )
            {
                /* We've committed to a fixed host buffer size, stick to that */
                framesGot = framesGot >= stream->maxFramesPerHostBuffer ? stream->maxFramesPerHostBuffer : 0;
            }
            else
            {
                /* We've committed to an upper bound on the size of host buffers */
                assert( paUtilBoundedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode );
                framesGot = PA_MIN( framesGot, stream->maxFramesPerHostBuffer );
            }
            PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
            /* Check the host buffer size against the buffer processor configuration */
            framesAvail -= framesGot;

            if( framesGot > 0 )
            {
                assert( !xrun );
                PaUtil_EndBufferProcessing( &stream->bufferProcessor, &callbackResult );
                PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            }
            PaUtil_EndCpuLoadMeasurement( &stream->cpuLoadMeasurer, framesGot );

            if( 0 == framesGot )
            {
                /* Go back to polling for more frames */
                break;

            }

            if( paContinue != callbackResult )
                break;
        }
    }

end:
    ; /* Hack to fix "label at end of compound statement" error caused by pthread_cleanup_pop(1) macro. */
    /* Match pthread_cleanup_push */
    pthread_cleanup_pop( 1 );

    PA_DEBUG(( "%s: Thread %d exiting\n ", __FUNCTION__, pthread_self() ));
    PaUnixThreading_EXIT( result );

error:
    PA_DEBUG(( "%s: Thread %d is canceled due to error %d\n ", __FUNCTION__, pthread_self(), result ));
    goto end;
}